

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O2

void Bbl_ManTestTruth(char *pSop,int nVars)

{
  uint *pTruth;
  char *__ptr;
  
  pTruth = Bbl_ManSopToTruth(pSop,nVars);
  __ptr = Bbl_ManTruthToSop(pTruth,nVars);
  printf("Old SOP:\n%s\n",pSop);
  printf("New SOP:\n%s\n",__ptr);
  free(__ptr);
  free(pTruth);
  return;
}

Assistant:

void Bbl_ManTestTruth( char * pSop, int nVars )
{
    unsigned * pTruth;
    char * pSopNew;
    pTruth = Bbl_ManSopToTruth( pSop, nVars );
    pSopNew = Bbl_ManTruthToSop( pTruth, nVars );
    printf( "Old SOP:\n%s\n", pSop );
    printf( "New SOP:\n%s\n", pSopNew );
    BBLIF_FREE( pSopNew );
    BBLIF_FREE( pTruth );
}